

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O0

void __thiscall
rangeless::fn::impl::
maybe<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
::maybe(maybe<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
        *this,maybe<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
              *other)

{
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  *val;
  maybe<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
  *other_local;
  maybe<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
  *this_local;
  
  this->m_empty = true;
  if ((other->m_empty & 1U) == 0) {
    val = operator*(other);
    reset(this,val);
    reset(other);
  }
  return;
}

Assistant:

maybe(maybe&& other) noexcept
        {        //^^ by value instead?
            if(!other.m_empty) {
                reset(std::move(*other));
                other.reset();
            }
        }